

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O2

RationalConstantType * __thiscall
Kernel::RationalConstantType::operator/
          (RationalConstantType *__return_storage_ptr__,RationalConstantType *this,
          RationalConstantType *o)

{
  RationalConstantType rhs;
  RationalConstantType lhs;
  IntegerConstantType local_70;
  IntegerConstantType local_60;
  RationalConstantType local_50;
  RationalConstantType local_30;
  
  RationalConstantType(&local_30,this);
  RationalConstantType(&local_50,o);
  IntegerConstantType::operator*(&local_60,&local_30._num);
  IntegerConstantType::operator*(&local_70,&local_30._den);
  RationalConstantType(__return_storage_ptr__,&local_60,&local_70);
  IntegerConstantType::~IntegerConstantType(&local_70);
  IntegerConstantType::~IntegerConstantType(&local_60);
  ~RationalConstantType(&local_50);
  ~RationalConstantType(&local_30);
  return __return_storage_ptr__;
}

Assistant:

RationalConstantType RationalConstantType::operator/(const RationalConstantType& o) const
{
  auto lhs = *this;
  auto rhs = o;
  return RationalConstantType(
      lhs._num * rhs._den, 
      lhs._den * rhs._num);
}